

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb-compat-util.h
# Opt level: O1

char * mmdb_strndup(char *str,size_t n)

{
  char *__dest;
  size_t sVar1;
  size_t __n;
  
  sVar1 = 0;
  __n = sVar1;
  if (n != 0) {
    do {
      __n = sVar1;
      if (str[sVar1] == '\0') break;
      sVar1 = sVar1 + 1;
      __n = n;
    } while (n != sVar1);
  }
  __dest = (char *)malloc(__n + 1);
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    memcpy(__dest,str,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

static char *mmdb_strndup(const char *str, size_t n) {
    size_t len;
    char *copy;

    len = mmdb_strnlen(str, n);
    if ((copy = malloc(len + 1)) == NULL)
        return (NULL);
    memcpy(copy, str, len);
    copy[len] = '\0';
    return (copy);
}